

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::OneofDescriptorProto::_InternalParse
          (OneofDescriptorProto *this,char *ptr,ParseContext *ctx)

{
  ArenaStringPtr *this_00;
  byte bVar1;
  byte bVar2;
  uint uVar3;
  OneofOptions *msg;
  uint32 res;
  uint tag;
  char *ptr_00;
  Arena *pAVar4;
  string *s;
  pair<const_char_*,_unsigned_int> pVar5;
  pair<const_char_*,_bool> pVar6;
  
  this_00 = &this->name_;
  do {
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ ==
          (long)(ctx->super_EpsCopyInputStream).limit_) {
        return (char *)(byte *)ptr;
      }
      pVar6 = internal::EpsCopyInputStream::DoneFallback
                        (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      ptr = pVar6.first;
      if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        return (char *)(byte *)ptr;
      }
    }
    bVar1 = *ptr;
    pVar5.second._0_1_ = bVar1;
    pVar5.first = (char *)((byte *)ptr + 1);
    pVar5._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = ((byte *)ptr)[1];
      res = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar5 = internal::ReadTagFallback(ptr,res);
        if (pVar5.first == (char *)0x0) {
          return (char *)0x0;
        }
      }
      else {
        pVar5.second = res;
        pVar5.first = (char *)((byte *)ptr + 2);
        pVar5._12_4_ = 0;
      }
    }
    ptr_00 = pVar5.first;
    tag = pVar5.second;
    uVar3 = (uint)(pVar5._8_8_ >> 3) & 0x1fffffff;
    if (uVar3 == 2) {
      if ((char)pVar5.second != '\x12') goto LAB_001721c4;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      msg = this->options_;
      if (msg == (OneofOptions *)0x0) {
        pAVar4 = (Arena *)(this->_internal_metadata_).
                          super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                          .ptr_;
        if (((ulong)pAVar4 & 1) != 0) {
          pAVar4 = *(Arena **)(((ulong)pAVar4 & 0xfffffffffffffffe) + 0x18);
        }
        msg = Arena::CreateMaybeMessage<google::protobuf::OneofOptions>(pAVar4);
        this->options_ = msg;
      }
      ptr = internal::ParseContext::ParseMessage<google::protobuf::OneofOptions>(ctx,msg,ptr_00);
    }
    else if ((uVar3 == 1) && ((char)pVar5.second == '\n')) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      pAVar4 = (Arena *)(this->_internal_metadata_).
                        super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        .ptr_;
      if (((ulong)pAVar4 & 1) != 0) {
        pAVar4 = *(Arena **)(((ulong)pAVar4 & 0xfffffffffffffffe) + 0x18);
      }
      s = this_00->ptr_;
      if (s == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance
                  (this_00,pAVar4,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        s = this_00->ptr_;
      }
      ptr = internal::InlineGreedyStringParser(s,ptr_00,ctx);
    }
    else {
LAB_001721c4:
      if ((tag == 0) || ((tag & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
        return ptr_00;
      }
      ptr = internal::UnknownFieldParse(tag,&this->_internal_metadata_,ptr_00,ctx);
    }
    if ((byte *)ptr == (byte *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* OneofDescriptorProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name(), ptr, ctx, "google.protobuf.OneofDescriptorProto.name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.OneofOptions options = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}